

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

t_path * __thiscall
xemmai::portable::t_path::operator/(t_path *__return_storage_ptr__,t_path *this,wstring_view a_path)

{
  wstring_view a_path_00;
  t_path *a_path_01;
  t_path local_58;
  t_path *local_38;
  wchar_t *pwStack_30;
  t_path *local_28;
  t_path *this_local;
  wstring_view a_path_local;
  
  pwStack_30 = a_path._M_str;
  local_38 = (t_path *)a_path._M_len;
  local_28 = this;
  this_local = local_38;
  a_path_local._M_len = (size_t)pwStack_30;
  a_path_local._M_str = (wchar_t *)__return_storage_ptr__;
  t_path(&local_58,this);
  a_path_00._M_str = pwStack_30;
  a_path_00._M_len = (size_t)local_38;
  a_path_01 = operator/=(&local_58,a_path_00);
  t_path(__return_storage_ptr__,a_path_01);
  ~t_path(&local_58);
  return __return_storage_ptr__;
}

Assistant:

t_path operator/(std::wstring_view a_path) const
	{
		return t_path(*this) /= a_path;
	}